

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O0

void kwsysProcessChildErrorExit(int errorPipe)

{
  int *piVar1;
  char *__src;
  size_t __n;
  kwsysProcess_ssize_t result;
  char buffer [1024];
  int errorPipe_local;
  
  piVar1 = __errno_location();
  __src = strerror(*piVar1);
  strncpy((char *)&result,__src,0x400);
  buffer[0x3f7] = '\0';
  __n = strlen((char *)&result);
  write(errorPipe,&result,__n);
  _exit(1);
}

Assistant:

static void kwsysProcessChildErrorExit(int errorPipe)
{
  /* Construct the error message.  */
  char buffer[KWSYSPE_PIPE_BUFFER_SIZE];
  kwsysProcess_ssize_t result;
  strncpy(buffer, strerror(errno), KWSYSPE_PIPE_BUFFER_SIZE);
  buffer[KWSYSPE_PIPE_BUFFER_SIZE - 1] = '\0';

  /* Report the error to the parent through the special pipe.  */
  result = write(errorPipe, buffer, strlen(buffer));
  (void)result;

  /* Terminate without cleanup.  */
  _exit(1);
}